

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O3

void joypad_append(JoypadBuffer *buffer,JoypadButtons *buttons,Ticks ticks)

{
  JoypadChunk *pJVar1;
  Bool BVar2;
  Bool BVar3;
  Bool BVar4;
  Bool BVar5;
  Bool BVar6;
  Bool BVar7;
  Bool BVar8;
  u8 uVar9;
  JoypadChunk *pJVar10;
  JoypadState *pJVar11;
  ulong uVar12;
  
  pJVar1 = (buffer->sentinel).prev;
  uVar12 = pJVar1->size;
  if (uVar12 < pJVar1->capacity) {
    pJVar11 = pJVar1->data;
    pJVar10 = pJVar1;
  }
  else {
    pJVar10 = (JoypadChunk *)calloc(1,0x28);
    pJVar11 = (JoypadState *)calloc(1,0x10000);
    pJVar10->data = pJVar11;
    pJVar10->capacity = 0x1000;
    pJVar10->next = &buffer->sentinel;
    pJVar10->prev = pJVar1;
    pJVar1->next = pJVar10;
    (buffer->sentinel).prev = pJVar10;
    uVar12 = 0;
  }
  pJVar10->size = uVar12 + 1;
  pJVar11[uVar12].ticks = ticks;
  uVar9 = joypad_pack_buttons(buttons);
  pJVar11[uVar12].buttons = uVar9;
  BVar2 = buttons->up;
  BVar3 = buttons->left;
  BVar4 = buttons->right;
  BVar5 = buttons->start;
  BVar6 = buttons->select;
  BVar7 = buttons->B;
  BVar8 = buttons->A;
  (buffer->last_buttons).down = buttons->down;
  (buffer->last_buttons).up = BVar2;
  (buffer->last_buttons).left = BVar3;
  (buffer->last_buttons).right = BVar4;
  (buffer->last_buttons).start = BVar5;
  (buffer->last_buttons).select = BVar6;
  (buffer->last_buttons).B = BVar7;
  (buffer->last_buttons).A = BVar8;
  return;
}

Assistant:

void joypad_append(JoypadBuffer* buffer, JoypadButtons* buttons, Ticks ticks) {
  JoypadState* state = alloc_joypad_state(buffer);
  state->ticks = ticks;
  state->buttons = joypad_pack_buttons(buttons);
  buffer->last_buttons = *buttons;
}